

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O3

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CJumpStatement *statement)

{
  CStatement *pCVar1;
  CJumpStatement *this_00;
  pointer *__ptr;
  INode local_28;
  _Alloc_hider local_20;
  
  this_00 = (CJumpStatement *)operator_new(0x10);
  CJumpStatement::getLabel(statement);
  CLabelStatement::CastCopy((CLabelStatement *)&local_28);
  local_20._M_p = (pointer)local_28._vptr_INode;
  local_28._vptr_INode = (_func_int **)0x0;
  CJumpStatement::CJumpStatement
            (this_00,(unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                      *)&local_20);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if ((_func_int **)local_20._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_20._M_p + 0x10))();
  }
  local_20._M_p = (pointer)0x0;
  if (local_28._vptr_INode != (_func_int **)0x0) {
    (**(code **)(*local_28._vptr_INode + 0x10))();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CJumpStatement &statement) {
    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CJumpStatement(
                            std::move(statement.getLabel()->CastCopy())
                    )
            )
    );
}